

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O1

__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
 __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>::
find<std::basic_string_view<char,std::char_traits<char>>>
          (QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal> *this,
          basic_string_view<char,_std::char_traits<char>_> *s,size_t t_hint)

{
  long lVar1;
  size_t __n;
  int iVar2;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  _Var3;
  ulong uVar4;
  long lVar5;
  
  lVar1 = *(long *)(this + 8);
  uVar4 = (*(long *)(this + 0x10) - lVar1 >> 4) * -0x5555555555555555;
  if (t_hint <= uVar4 && uVar4 - t_hint != 0) {
    lVar5 = t_hint * 0x30;
    __n = *(size_t *)(lVar1 + 8 + lVar5);
    if (__n == s->_M_len) {
      if (__n != 0) {
        iVar2 = bcmp(*(void **)(lVar1 + lVar5),s->_M_str,__n);
        if (iVar2 != 0) goto LAB_001bbdfe;
      }
      return (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
              )(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
                *)(lVar1 + lVar5);
    }
  }
LAB_001bbdfe:
  _Var3 = find<std::basic_string_view<char,std::char_traits<char>>>(this,s);
  return (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
          )_Var3._M_current;
}

Assistant:

auto find(const Lookup &s, const std::size_t t_hint) const noexcept {
      if (data.size() > t_hint && comparator(data[t_hint].first, s)) {
        const auto begin = std::cbegin(data);
        return std::next(begin, static_cast<typename std::iterator_traits<std::decay_t<decltype(begin)>>::difference_type>(t_hint));
      } else {
        return find(s);
      }
    }